

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void SubRefTimestep(SstStream Stream,ssize_t Timestep,int SetLast)

{
  CPTimestepList p_Var1;
  uint uVar2;
  CPTimestepList *pp_Var3;
  
  pp_Var3 = &Stream->QueuedTimesteps;
  while (p_Var1 = *pp_Var3, p_Var1 != (CPTimestepList)0x0) {
    if (p_Var1->Timestep == Timestep) {
      uVar2 = p_Var1->ReferenceCount - 1;
      p_Var1->ReferenceCount = uVar2;
      CP_verbose(Stream,TraceVerbose,
                 "SubRef : Writer-side Timestep %ld now has reference count %d, expired %d, precious %d\n"
                 ,Timestep,(ulong)uVar2,(ulong)(uint)p_Var1->Expired,p_Var1->PreciousTimestep);
    }
    pp_Var3 = &p_Var1->Next;
  }
  return;
}

Assistant:

static void SubRefTimestep(SstStream Stream, ssize_t Timestep, int SetLast)
{
    CPTimestepList List;
    List = Stream->QueuedTimesteps;
    STREAM_ASSERT_LOCKED(Stream);
    while (List)
    {
        if (List->Timestep == Timestep)
        {
            List->ReferenceCount--;
            CP_verbose(Stream, TraceVerbose,
                       "SubRef : Writer-side Timestep %ld "
                       "now has reference count %d, expired %d, precious %d\n",
                       List->Timestep, List->ReferenceCount, List->Expired, List->PreciousTimestep);
        }
        List = List->Next;
    }
}